

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassUserData(void *arkode_mem,void *user_data)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8[1] != (ARKodeMem)0x0) {
      in_stack_ffffffffffffffd8[4] = in_RSI;
    }
    in_stack_ffffffffffffffd8[0x18] = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetMassUserData(void *arkode_mem, void* user_data)
{
  ARKodeMem     ark_mem;
  ARKLsMassMem  arkls_mem;
  int           retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassUserData",
                               &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* Set data for mass matrix */
  if (arkls_mem->mass != NULL)
    arkls_mem->M_data = user_data;

  /* Data for Mtimes is set in arkLSSetMassTimes */

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return(ARKLS_SUCCESS);
}